

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.upb.h
# Opt level: O0

upb_StringView google_protobuf_FileDescriptorProto_name(google_protobuf_FileDescriptorProto *msg)

{
  size_t to;
  _Bool _Var1;
  void *from;
  undefined1 local_5c [8];
  upb_MiniTableField field;
  upb_StringView default_val;
  google_protobuf_FileDescriptorProto *msg_local;
  upb_StringView ret;
  
  join_0x00000010_0x00000000_ = upb_StringView_FromString("");
  local_5c._0_4_ = 1;
  local_5c._4_2_ = 0x10;
  local_5c._6_2_ = 0x40;
  field.number_dont_copy_me__upb_internal_use_only = 0x920cffff;
  ret.size = (size_t)&msg_local;
  _Var1 = upb_MiniTableField_IsExtension((upb_MiniTableField *)local_5c);
  if (_Var1) {
    __assert_fail("!upb_MiniTableField_IsExtension(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x10d,
                  "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                 );
  }
  _Var1 = upb_MiniTableField_IsInOneof((upb_MiniTableField *)local_5c);
  if (((_Var1) ||
      (_Var1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                         ((upb_MiniTableField *)local_5c,
                          &field.offset_dont_copy_me__upb_internal_use_only), !_Var1)) &&
     (_Var1 = upb_Message_HasBaseField
                        (&msg->base_dont_copy_me__upb_internal_use_only,
                         (upb_MiniTableField *)local_5c), !_Var1)) {
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
              ((upb_MiniTableField *)local_5c,(void *)ret.size,
               &field.offset_dont_copy_me__upb_internal_use_only);
    return _msg_local;
  }
  to = ret.size;
  from = _upb_Message_DataPtr_dont_copy_me__upb_internal_use_only
                   (&msg->base_dont_copy_me__upb_internal_use_only,(upb_MiniTableField *)local_5c);
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            ((upb_MiniTableField *)local_5c,(void *)to,from);
  return _msg_local;
}

Assistant:

UPB_INLINE upb_StringView google_protobuf_FileDescriptorProto_name(const google_protobuf_FileDescriptorProto* msg) {
  upb_StringView default_val = upb_StringView_FromString("");
  upb_StringView ret;
  const upb_MiniTableField field = {1, UPB_SIZE(56, 16), 64, kUpb_NoSub, 12, (int)kUpb_FieldMode_Scalar | (int)kUpb_LabelFlags_IsAlternate | ((int)kUpb_FieldRep_StringView << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}